

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

float glu::TextureTestUtil::computeLodFromDerivates(LodMode mode,float dudx,float dudy)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = 0.0;
  if (mode < LODMODE_LAST) {
    uVar1 = -(uint)(-dudx <= dudx);
    uVar2 = -(uint)(-dudy <= dudy);
    fVar3 = (float)(~uVar1 & (uint)-dudx | (uint)dudx & uVar1);
    fVar4 = (float)(~uVar2 & (uint)-dudy | (uint)dudy & uVar2);
    uVar1 = -(uint)(fVar4 <= fVar3);
    fVar3 = (float)(~uVar1 & (uint)fVar4 | (uint)fVar3 & uVar1);
  }
  fVar3 = deFloatLog2(fVar3);
  return fVar3;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dudy)
{
	float p = 0.0f;
	switch (mode)
	{
		// \note [mika] Min and max bounds equal to exact with 1D textures
		case LODMODE_EXACT:
		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
			p = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}